

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O1

int reflect_damage(int *reflect,int damage)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar2 = *reflect;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_30a9c,0xd);
  dVar1 = *(double *)(&DAT_0010e580 + (ulong)(iVar2 == 2) * 8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)((double)damage * dVar1));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_30ab2,0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return (int)((double)damage * dVar1);
}

Assistant:

int reflect_damage(int* reflect,int damage)
{
    if(*reflect==2)
    {
        damage *= 0.4;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
    else
    {
        damage *= 0.4*2;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
}